

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O1

void __thiscall
icu_63::UVector::insertElementAt(UVector *this,int32_t elem,int32_t index,UErrorCode *status)

{
  UBool UVar1;
  ulong uVar2;
  long lVar3;
  
  if (((-1 < index) && (index <= this->count)) &&
     (UVar1 = ensureCapacity(this,this->count + 1,status), UVar1 != '\0')) {
    lVar3 = (long)this->count;
    uVar2 = (ulong)(uint)index;
    if (index < this->count) {
      do {
        this->elements[lVar3] = this->elements[lVar3 + -1];
        lVar3 = lVar3 + -1;
      } while ((long)uVar2 < lVar3);
    }
    this->elements[uVar2].pointer = (void *)0x0;
    this->elements[uVar2].integer = elem;
    this->count = this->count + 1;
  }
  return;
}

Assistant:

void UVector::insertElementAt(int32_t elem, int32_t index, UErrorCode &status) {
    // must have 0 <= index <= count
    if (0 <= index && index <= count && ensureCapacity(count + 1, status)) {
        for (int32_t i=count; i>index; --i) {
            elements[i] = elements[i-1];
        }
        elements[index].pointer = NULL;
        elements[index].integer = elem;
        ++count;
    }
    /* else index out of range */
}